

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall
r_exec::Group::_initiate_sln_propagation
          (Group *this,Code *object,double change,double source_sln_thr)

{
  ushort uVar1;
  char cVar2;
  bool bVar3;
  ushort uVar4;
  Code *object_00;
  Code **ppCVar5;
  double extraout_XMM0_Qa;
  iterator iVar6;
  iterator local_80;
  iterator local_70;
  undefined1 local_60 [8];
  const_iterator m;
  uint16_t i;
  undefined1 local_40 [8];
  vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> path;
  double source_sln_thr_local;
  double change_local;
  Code *object_local;
  Group *this_local;
  
  path.super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)source_sln_thr;
  change_local = (double)object;
  object_local = (Code *)this;
  (*(object->super__Object)._vptr__Object[0x15])();
  if (extraout_XMM0_Qa < ABS(change)) {
    std::vector<r_code::Code_*,_std::allocator<r_code::Code_*>_>::vector
              ((vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *)local_40);
    std::vector<r_code::Code_*,_std::allocator<r_code::Code_*>_>::push_back
              ((vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *)local_40,
               (value_type *)&change_local);
    (**(code **)(*(long *)change_local + 0x20))(change_local,0);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x3c) {
      for (m._list._2_2_ = 0; uVar1 = m._list._2_2_,
          uVar4 = (**(code **)(*(long *)change_local + 0x50))(), uVar1 < uVar4;
          m._list._2_2_ = m._list._2_2_ + 1) {
        object_00 = (Code *)(**(code **)(*(long *)change_local + 0x48))(change_local,m._list._2_2_);
        _propagate_sln(this,object_00,change,
                       (double)path.
                               super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *)local_40);
      }
    }
    (**(code **)(*(long *)change_local + 0x98))();
    r_code::list<r_code::Code_*>::const_iterator::const_iterator((const_iterator *)local_60);
    local_70 = r_code::list<r_code::Code_*>::begin
                         ((list<r_code::Code_*> *)((long)change_local + 0x18));
    r_code::list<r_code::Code_*>::const_iterator::operator=((const_iterator *)local_60,&local_70);
    while( true ) {
      iVar6 = r_code::list<r_code::Code_*>::end((list<r_code::Code_*> *)((long)change_local + 0x18))
      ;
      local_80 = iVar6;
      bVar3 = r_code::list<r_code::Code_*>::_iterator::operator!=
                        ((_iterator *)local_60,&local_80.super__iterator);
      if (!bVar3) break;
      ppCVar5 = r_code::list<r_code::Code_*>::const_iterator::operator*((const_iterator *)local_60);
      _propagate_sln(this,*ppCVar5,change,
                     (double)path.
                             super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *)local_40);
      r_code::list<r_code::Code_*>::const_iterator::operator++((const_iterator *)local_60);
    }
    (**(code **)(*(long *)change_local + 0xa0))();
    std::vector<r_code::Code_*,_std::allocator<r_code::Code_*>_>::~vector
              ((vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *)local_40);
  }
  return;
}

Assistant:

void Group::_initiate_sln_propagation(Code *object, double change, double source_sln_thr) const
{
    if (fabs(change) > object->get_psln_thr()) {
        std::vector<Code *> path;
        path.push_back(object);

        if (object->code(0).getDescriptor() == Atom::MARKER) { // if marker, propagate to references.
            for (uint16_t i = 0; i < object->references_size(); ++i) {
                _propagate_sln(object->get_reference(i), change, source_sln_thr, path);
            }
        }

        // propagate to markers
        object->acq_markers();
        r_code::list<Code *>::const_iterator m;

        for (m = object->markers.begin(); m != object->markers.end(); ++m) {
            _propagate_sln(*m, change, source_sln_thr, path);
        }

        object->rel_markers();
    }
}